

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.hpp
# Opt level: O3

void __thiscall
helics::FilterInfo::FilterInfo
          (FilterInfo *this,GlobalBrokerId core_id_,InterfaceHandle handle_,string_view key_,
          string_view type_in_,string_view type_out_,bool destFilter_)

{
  (this->core_id).gid = core_id_.gid;
  (this->handle).hid = handle_.hid;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->key,key_._M_str,key_._M_str + key_._M_len);
  (this->inputType)._M_dataplus._M_p = (pointer)&(this->inputType).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->inputType,type_in_._M_str,type_in_._M_str + type_in_._M_len);
  (this->outputType)._M_dataplus._M_p = (pointer)&(this->outputType).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->outputType,type_out_._M_str,type_out_._M_str + type_out_._M_len);
  (this->destTargets).
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->destTargets).
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sourceTargets).
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->destTargets).
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceTargets).
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceTargets).
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->dest_filter = destFilter_;
  this->cloning = false;
  this->flags = 0;
  (this->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sourceEndpoints).
  super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceEndpoints).
  super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sourceEndpoints).
  super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->destEndpoints).
  super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->destEndpoints).
  super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->destEndpoints).
  super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sourceEpts)._M_dataplus._M_p = (pointer)&(this->sourceEpts).field_2;
  (this->sourceEpts)._M_string_length = 0;
  (this->sourceEpts).field_2._M_local_buf[0] = '\0';
  (this->destEpts)._M_dataplus._M_p = (pointer)&(this->destEpts).field_2;
  (this->destEpts)._M_string_length = 0;
  (this->destEpts).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

FilterInfo(GlobalBrokerId core_id_,
               InterfaceHandle handle_,
               std::string_view key_,
               std::string_view type_in_,
               std::string_view type_out_,
               bool destFilter_):
        core_id(core_id_), handle(handle_), key(key_), inputType(type_in_), outputType(type_out_),
        dest_filter(destFilter_)
    {
    }